

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiDisplayTimingTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)18>_> *
vkt::wsi::anon_unknown_0::createPipeline
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,DeviceInterface *vkd,
          VkDevice device,VkRenderPass renderPass,VkPipelineLayout layout,
          VkShaderModule vertexShaderModule,VkShaderModule fragmentShaderModule,deUint32 width,
          deUint32 height)

{
  VkPipelineCache local_368;
  undefined1 local_360 [8];
  VkGraphicsPipelineCreateInfo createInfo;
  VkPipelineDynamicStateCreateInfo dynamicState;
  VkPipelineColorBlendStateCreateInfo blendState;
  VkPipelineColorBlendAttachmentState attachmentBlendState;
  VkPipelineDepthStencilStateCreateInfo depthStencilState;
  VkPipelineMultisampleStateCreateInfo multisampleState;
  undefined1 local_1b8 [4];
  VkSampleMask sampleMask;
  VkPipelineRasterizationStateCreateInfo rasterizationState;
  VkPipelineViewportStateCreateInfo viewportState;
  VkRect2D scissors [1];
  VkViewport viewports [1];
  undefined1 auStack_118 [8];
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyState;
  VkPipelineVertexInputStateCreateInfo vertexInputState;
  VkPipelineShaderStageCreateInfo stages [2];
  VkSpecializationInfo shaderSpecialization;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  VkShaderModule fragmentShaderModule_local;
  VkShaderModule vertexShaderModule_local;
  VkPipelineLayout layout_local;
  VkRenderPass renderPass_local;
  
  stages[1].pSpecializationInfo = (VkSpecializationInfo *)0x0;
  vertexInputState.pVertexAttributeDescriptions._0_4_ = 0x12;
  stages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  stages[0]._4_4_ = 0;
  stages[0].pNext._0_4_ = 0;
  stages[0].pNext._4_4_ = 1;
  stages[0].module.m_internal = (long)"pre_main" + 4;
  stages[0].pName = (char *)&stages[1].pSpecializationInfo;
  stages[0].pSpecializationInfo._0_4_ = 0x12;
  stages[1].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  stages[1]._4_4_ = 0;
  stages[1].pNext._0_4_ = 0;
  stages[1].pNext._4_4_ = 0x10;
  stages[1]._16_8_ = fragmentShaderModule.m_internal;
  stages[1].module.m_internal = (long)"pre_main" + 4;
  vertexInputState.pVertexBindingDescriptions = (VkVertexInputBindingDescription *)0x0;
  vertexInputState.vertexAttributeDescriptionCount = 0;
  vertexInputState._36_4_ = 0;
  vertexInputState.pNext = (void *)0x0;
  vertexInputState.flags = 0;
  vertexInputState.vertexBindingDescriptionCount = 0;
  vertexInputState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vertexInputState._4_4_ = 0;
  inputAssemblyState.primitiveRestartEnable = 0x13;
  inputAssemblyState._28_4_ = 0;
  inputAssemblyState.pNext = (void *)0x300000000;
  inputAssemblyState.flags = 0;
  inputAssemblyState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  auStack_118 = (undefined1  [8])0x14;
  inputAssemblyState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  inputAssemblyState._4_4_ = 0;
  scissors[0].extent.width = 0;
  scissors[0].extent.height = 0;
  viewportState.pScissors._0_4_ = 0;
  viewportState.pScissors._4_4_ = 0;
  scissors[0].offset.x = width;
  scissors[0].offset.y = height;
  rasterizationState.lineWidth = 3.08286e-44;
  viewportState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  viewportState._4_4_ = 0;
  viewportState.pNext._0_4_ = 0;
  viewportState.pNext._4_4_ = 1;
  viewportState._16_8_ = &scissors[0].extent;
  viewportState.pViewports._0_4_ = 1;
  viewportState._32_8_ = &viewportState.pScissors;
  stages[0]._16_8_ = vertexShaderModule.m_internal;
  stages[1].pName = stages[0].pName;
  memset(local_1b8,0,0x40);
  local_1b8 = (undefined1  [4])0x26;
  rasterizationState.pNext._4_4_ = 1;
  rasterizationState.polygonMode = VK_POLYGON_MODE_LINE;
  rasterizationState.depthBiasClamp = 1.0;
  multisampleState.alphaToOneEnable = 0xffffffff;
  depthStencilState.minDepthBounds = 3.36312e-44;
  multisampleState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  multisampleState._4_4_ = 0;
  multisampleState.pNext._0_4_ = 0;
  multisampleState.pNext._4_4_ = 1;
  multisampleState.flags = 0;
  multisampleState.rasterizationSamples = 0;
  multisampleState._24_8_ = &multisampleState.alphaToOneEnable;
  multisampleState.pSampleMask._0_4_ = 0;
  multisampleState.pSampleMask._4_4_ = 0;
  memset(&attachmentBlendState.alphaBlendOp,0,0x68);
  attachmentBlendState.alphaBlendOp = 0x19;
  depthStencilState.depthTestEnable = 7;
  depthStencilState.front.passOp = VK_STENCIL_OP_DECREMENT_AND_WRAP;
  depthStencilState.back.passOp = VK_STENCIL_OP_DECREMENT_AND_WRAP;
  depthStencilState.back.reference = 0x3f800000;
  blendState.blendConstants[2] = 0.0;
  blendState.blendConstants[3] = 1.4013e-45;
  attachmentBlendState.blendEnable = 0;
  attachmentBlendState.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  attachmentBlendState.dstColorBlendFactor = VK_BLEND_FACTOR_ONE;
  attachmentBlendState.colorBlendOp = VK_BLEND_OP_ADD;
  attachmentBlendState.srcAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  attachmentBlendState.dstAlphaBlendFactor = VK_BLEND_FACTOR_SRC1_COLOR;
  dynamicState.pDynamicStates._0_4_ = 0x1a;
  blendState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  blendState._4_4_ = 0;
  blendState.pNext._0_4_ = 0;
  blendState.pNext._4_4_ = 0;
  blendState.flags = 3;
  blendState.logicOpEnable = 1;
  blendState._24_8_ = blendState.blendConstants + 2;
  blendState.pAttachments._0_4_ = 0;
  blendState.pAttachments._4_4_ = 0;
  blendState.blendConstants[0] = 0.0;
  blendState.blendConstants[1] = 0.0;
  createInfo.basePipelineIndex = 0x1b;
  createInfo._140_4_ = 0;
  dynamicState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  dynamicState._4_4_ = 0;
  dynamicState.pNext = (void *)0x0;
  dynamicState.flags = 0;
  dynamicState.dynamicStateCount = 0;
  local_360._0_4_ = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo._4_4_ = 0;
  createInfo.pNext._0_4_ = 0;
  createInfo.pNext._4_4_ = 2;
  createInfo._16_8_ = &vertexInputState.pVertexAttributeDescriptions;
  createInfo.pStages = (VkPipelineShaderStageCreateInfo *)&inputAssemblyState.primitiveRestartEnable
  ;
  createInfo.pVertexInputState = (VkPipelineVertexInputStateCreateInfo *)auStack_118;
  createInfo.pInputAssemblyState = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  createInfo.pTessellationState =
       (VkPipelineTessellationStateCreateInfo *)&rasterizationState.lineWidth;
  createInfo.pViewportState = (VkPipelineViewportStateCreateInfo *)local_1b8;
  createInfo.pRasterizationState =
       (VkPipelineRasterizationStateCreateInfo *)&depthStencilState.minDepthBounds;
  createInfo.pMultisampleState =
       (VkPipelineMultisampleStateCreateInfo *)&attachmentBlendState.alphaBlendOp;
  createInfo.pDepthStencilState =
       (VkPipelineDepthStencilStateCreateInfo *)&dynamicState.pDynamicStates;
  createInfo.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)&createInfo.basePipelineIndex
  ;
  createInfo.renderPass.m_internal._0_4_ = 0;
  createInfo.pDynamicState = (VkPipelineDynamicStateCreateInfo *)layout.m_internal;
  createInfo.layout.m_internal = renderPass.m_internal;
  ::vk::Handle<(vk::HandleType)18>::Handle((Handle<(vk::HandleType)18> *)&createInfo.subpass,0);
  createInfo.basePipelineHandle.m_internal._0_4_ = 0;
  ::vk::Handle<(vk::HandleType)15>::Handle(&local_368,0);
  ::vk::createGraphicsPipeline
            (__return_storage_ptr__,vkd,device,local_368,(VkGraphicsPipelineCreateInfo *)local_360,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

vk::Move<vk::VkPipeline> createPipeline (const vk::DeviceInterface&	vkd,
										 vk::VkDevice				device,
										 vk::VkRenderPass			renderPass,
										 vk::VkPipelineLayout		layout,
										 vk::VkShaderModule			vertexShaderModule,
										 vk::VkShaderModule			fragmentShaderModule,
										 deUint32					width,
										 deUint32					height)
{
	const vk::VkSpecializationInfo				shaderSpecialization	=
	{
		0u,
		DE_NULL,
		0,
		DE_NULL
	};
	const vk::VkPipelineShaderStageCreateInfo		stages[]			=
	{
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,
			DE_NULL,
			0u,
			vk::VK_SHADER_STAGE_VERTEX_BIT,
			vertexShaderModule,
			"main",
			&shaderSpecialization
		},
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,
			DE_NULL,
			0u,
			vk::VK_SHADER_STAGE_FRAGMENT_BIT,
			fragmentShaderModule,
			"main",
			&shaderSpecialization
		}
	};
	const vk::VkPipelineVertexInputStateCreateInfo	vertexInputState	=
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,
		DE_NULL,
		0u,
		0u,
		DE_NULL,
		0u,
		DE_NULL
	};
	const vk::VkPipelineInputAssemblyStateCreateInfo	inputAssemblyState	=
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,
		DE_NULL,
		0u,
		vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,
		VK_FALSE
	};
	const vk::VkViewport viewports[] =
	{
		{
			0.0f, 0.0f,
			(float)width, (float)height,
			0.0f, 1.0f
		}
	};
	const vk::VkRect2D scissors[] =
	{
		{
			{ 0u, 0u },
			{ width, height }
		}
	};
	const vk::VkPipelineViewportStateCreateInfo			viewportState		=
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,
		DE_NULL,
		0u,

		DE_LENGTH_OF_ARRAY(viewports),
		viewports,
		DE_LENGTH_OF_ARRAY(scissors),
		scissors
	};
	const vk::VkPipelineRasterizationStateCreateInfo	rasterizationState	=
	{
		vk::VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,
		DE_NULL,
		0u,
		VK_TRUE,
		VK_FALSE,
		vk::VK_POLYGON_MODE_FILL,
		vk::VK_CULL_MODE_NONE,
		vk::VK_FRONT_FACE_CLOCKWISE,
		VK_FALSE,
		0.0f,
		0.0f,
		0.0f,
		1.0f
	};
	const vk::VkSampleMask								sampleMask			= ~0u;
	const vk::VkPipelineMultisampleStateCreateInfo		multisampleState	=
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,
		DE_NULL,
		0u,
		vk::VK_SAMPLE_COUNT_1_BIT,
		VK_FALSE,
		0.0f,
		&sampleMask,
		VK_FALSE,
		VK_FALSE
	};
	const vk::VkPipelineDepthStencilStateCreateInfo	depthStencilState		=
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,
		DE_NULL,
		0u,
		DE_FALSE,
		DE_FALSE,
		vk::VK_COMPARE_OP_ALWAYS,
		DE_FALSE,
		DE_FALSE,
		{
			vk::VK_STENCIL_OP_KEEP,
			vk::VK_STENCIL_OP_KEEP,
			vk::VK_STENCIL_OP_KEEP,
			vk::VK_COMPARE_OP_ALWAYS,
			0u,
			0u,
			0u,
		},
		{
			vk::VK_STENCIL_OP_KEEP,
			vk::VK_STENCIL_OP_KEEP,
			vk::VK_STENCIL_OP_KEEP,
			vk::VK_COMPARE_OP_ALWAYS,
			0u,
			0u,
			0u,
		},
		0.0f,
		1.0f
	};
	const vk::VkPipelineColorBlendAttachmentState	attachmentBlendState			=
	{
		VK_FALSE,
		vk::VK_BLEND_FACTOR_ONE,
		vk::VK_BLEND_FACTOR_ZERO,
		vk::VK_BLEND_OP_ADD,
		vk::VK_BLEND_FACTOR_ONE,
		vk::VK_BLEND_FACTOR_ZERO,
		vk::VK_BLEND_OP_ADD,
		(vk::VK_COLOR_COMPONENT_R_BIT|
		 vk::VK_COLOR_COMPONENT_G_BIT|
		 vk::VK_COLOR_COMPONENT_B_BIT|
		 vk::VK_COLOR_COMPONENT_A_BIT),
	};
	const vk::VkPipelineColorBlendStateCreateInfo	blendState				=
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,
		DE_NULL,
		0u,
		DE_FALSE,
		vk::VK_LOGIC_OP_COPY,
		1u,
		&attachmentBlendState,
		{ 0.0f, 0.0f, 0.0f, 0.0f }
	};
	const vk::VkPipelineDynamicStateCreateInfo			dynamicState		=
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO,
		DE_NULL,
		0u,

		0u,
		DE_NULL
	};
	const vk::VkGraphicsPipelineCreateInfo				createInfo			=
	{
		vk::VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,
		DE_NULL,
		0u,

		DE_LENGTH_OF_ARRAY(stages),
		stages,
		&vertexInputState,
		&inputAssemblyState,
		DE_NULL,
		&viewportState,
		&rasterizationState,
		&multisampleState,
		&depthStencilState,
		&blendState,
		&dynamicState,
		layout,
		renderPass,
		0u,
		DE_NULL,
		0u
	};

	return vk::createGraphicsPipeline(vkd, device, DE_NULL,  &createInfo);
}